

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::gjInverse(Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float *pfVar5;
  SingMatrixExc *pSVar6;
  byte in_DL;
  Matrix44<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float f_1;
  float f;
  float tmp_1;
  float tmp;
  float pivotsize;
  int pivot;
  Matrix44<float> t;
  Matrix44<float> s;
  int k;
  int j;
  int i;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float local_ac;
  float local_a8;
  int local_a4;
  Matrix44<float> local_a0;
  Matrix44<float> local_60;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Matrix44((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Matrix44(&local_a0,in_RSI);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    local_a4 = local_18;
    pfVar5 = operator[](&local_a0,local_18);
    local_a8 = pfVar5[local_18];
    local_1c = local_18;
    if (local_a8 < 0.0) {
      local_a8 = -local_a8;
    }
    while (local_1c = local_1c + 1, local_1c < 4) {
      pfVar5 = operator[](&local_a0,local_1c);
      local_ac = pfVar5[local_18];
      if (local_ac < 0.0) {
        local_ac = -local_ac;
      }
      if (local_a8 < local_ac) {
        local_a4 = local_1c;
        local_a8 = local_ac;
      }
    }
    if ((local_a8 == 0.0) && (!NAN(local_a8))) {
      if ((local_11 & 1) == 0) {
        Matrix44((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        return in_RDI;
      }
      pSVar6 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
      Imath_2_5::SingMatrixExc::SingMatrixExc(pSVar6,"Cannot invert singular matrix.");
      __cxa_throw(pSVar6,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
    }
    iVar4 = local_18;
    if (local_a4 != local_18) {
      for (local_1c = 0; iVar4 = local_18, local_1c < 4; local_1c = local_1c + 1) {
        pfVar5 = operator[](&local_a0,local_18);
        fVar1 = pfVar5[local_1c];
        pfVar5 = operator[](&local_a0,local_a4);
        fVar2 = pfVar5[local_1c];
        pfVar5 = operator[](&local_a0,local_18);
        pfVar5[local_1c] = fVar2;
        pfVar5 = operator[](&local_a0,local_a4);
        pfVar5[local_1c] = fVar1;
        pfVar5 = operator[](&local_60,local_18);
        fVar1 = pfVar5[local_1c];
        pfVar5 = operator[](&local_60,local_a4);
        fVar2 = pfVar5[local_1c];
        pfVar5 = operator[](&local_60,local_18);
        pfVar5[local_1c] = fVar2;
        pfVar5 = operator[](&local_60,local_a4);
        pfVar5[local_1c] = fVar1;
      }
    }
    while (local_1c = iVar4 + 1, local_1c < 4) {
      pfVar5 = operator[](&local_a0,local_1c);
      fVar1 = pfVar5[local_18];
      pfVar5 = operator[](&local_a0,local_18);
      fVar2 = pfVar5[local_18];
      for (local_20 = 0; iVar4 = local_1c, local_20 < 4; local_20 = local_20 + 1) {
        pfVar5 = operator[](&local_a0,local_18);
        fVar3 = pfVar5[local_20];
        pfVar5 = operator[](&local_a0,local_1c);
        pfVar5[local_20] = -(fVar1 / fVar2) * fVar3 + pfVar5[local_20];
        pfVar5 = operator[](&local_60,local_18);
        fVar3 = pfVar5[local_20];
        pfVar5 = operator[](&local_60,local_1c);
        pfVar5[local_20] = -(fVar1 / fVar2) * fVar3 + pfVar5[local_20];
      }
    }
  }
  local_18 = 3;
  while( true ) {
    if (local_18 < 0) {
      Matrix44(in_RDI,&local_60);
      return in_RDI;
    }
    pfVar5 = operator[](&local_a0,local_18);
    fVar1 = pfVar5[local_18];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      pfVar5 = operator[](&local_a0,local_18);
      pfVar5[local_1c] = pfVar5[local_1c] / fVar1;
      pfVar5 = operator[](&local_60,local_18);
      pfVar5[local_1c] = pfVar5[local_1c] / fVar1;
    }
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      pfVar5 = operator[](&local_a0,local_1c);
      fVar1 = pfVar5[local_18];
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        in_stack_fffffffffffffee0 = fVar1;
        pfVar5 = operator[](&local_a0,local_18);
        in_stack_fffffffffffffee4 = pfVar5[local_20];
        pfVar5 = operator[](&local_a0,local_1c);
        pfVar5[local_20] = -in_stack_fffffffffffffee0 * in_stack_fffffffffffffee4 + pfVar5[local_20]
        ;
        pfVar5 = operator[](&local_60,local_18);
        fVar2 = pfVar5[local_20];
        pfVar5 = operator[](&local_60,local_1c);
        pfVar5[local_20] = -fVar1 * fVar2 + pfVar5[local_20];
      }
    }
    local_18 = local_18 + -1;
  }
  if ((local_11 & 1) == 0) {
    Matrix44((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    return in_RDI;
  }
  pSVar6 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
  Imath_2_5::SingMatrixExc::SingMatrixExc(pSVar6,"Cannot invert singular matrix.");
  __cxa_throw(pSVar6,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
}

Assistant:

Matrix44<T>
Matrix44<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix44();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 4; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix44();
        }

        for (j = 0; j < 4; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 4; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}